

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintStatsMiter(Gia_Man_t *p,int fVerbose)

{
  Vec_Int_t *p_00;
  int iVar1;
  int i;
  int iVar2;
  uint uVar3;
  Vec_Flt_t *__ptr;
  Gia_Obj_t *pObj;
  int nCapMin;
  uint v;
  int iVar5;
  long lVar6;
  int iObjId;
  Vec_Flt_t *local_38;
  long lVar4;
  
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  __ptr = Gia_ManPrintOutputProb(p);
  puts("Statistics for each outputs of the miter:");
  local_38 = __ptr;
  for (v = 0; (int)v < p->vCos->nSize - p->nRegs; v = v + 1) {
    pObj = Gia_ManCo(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iObjId = Gia_ObjId(p,pObj);
    printf("%4d : ",(ulong)v);
    i = iObjId;
    lVar6 = (long)iObjId;
    p_00 = p->vLevels;
    iVar2 = p_00->nSize;
    if (iVar2 <= iObjId) {
      iVar1 = p_00->nCap * 2;
      iVar5 = (int)(lVar6 + 1);
      nCapMin = iVar5;
      if ((iVar1 <= iObjId) || (nCapMin = iVar1, p_00->nCap <= iObjId)) {
        Vec_IntGrow(p_00,nCapMin);
        iVar2 = p_00->nSize;
      }
      for (lVar4 = (long)iVar2; lVar4 < lVar6 + 1; lVar4 = lVar4 + 1) {
        p_00->pArray[lVar4] = 0;
      }
      p_00->nSize = iVar5;
      __ptr = local_38;
    }
    uVar3 = Vec_IntEntry(p_00,i);
    printf("Level = %5d  ",(ulong)uVar3);
    uVar3 = Gia_ManSuppSize(p,&iObjId,1);
    printf("Supp = %5d  ",(ulong)uVar3);
    uVar3 = Gia_ManConeSize(p,&iObjId,1);
    printf("Cone = %5d  ",(ulong)uVar3);
    uVar3 = Gia_NodeMffcSize(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
    printf("Mffc = %5d  ",(ulong)uVar3);
    if (((long)iObjId < 0) || (__ptr->nSize <= iObjId)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                    ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
    }
    printf("Prob = %8.4f  ",(double)__ptr->pArray[iObjId]);
    putchar(10);
  }
  free(__ptr->pArray);
  free(__ptr);
  return;
}

Assistant:

void Gia_ManPrintStatsMiter( Gia_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Flt_t * vProb;
    int i, iObjId;
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    vProb = Gia_ManPrintOutputProb( p );
    printf( "Statistics for each outputs of the miter:\n" );
    Gia_ManForEachPo( p, pObj, i )
    {
        iObjId = Gia_ObjId(p, pObj);
        printf( "%4d : ", i );
        printf( "Level = %5d  ",  Gia_ObjLevelId(p, iObjId) );
        printf( "Supp = %5d  ",   Gia_ManSuppSize(p, &iObjId, 1) );
        printf( "Cone = %5d  ",   Gia_ManConeSize(p, &iObjId, 1) );
        printf( "Mffc = %5d  ",   Gia_NodeMffcSize(p, Gia_ObjFanin0(pObj)) );
        printf( "Prob = %8.4f  ", Vec_FltEntry(vProb, iObjId) );
        printf( "\n" );
    }
    Vec_FltFree( vProb );
}